

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::ElementsPeginTxIn,_cfd::js::api::ElementsPeginTxInStruct>::
ConvertToStruct(vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::ElementsPeginTxIn,_cfd::js::api::ElementsPeginTxInStruct>
               *this)

{
  bool bVar1;
  undefined1 local_180 [8];
  ElementsPeginTxInStruct data;
  ElementsPeginTxIn *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::ElementsPeginTxIn,_cfd::js::api::ElementsPeginTxInStruct>
  *__range3;
  JsonObjectVector<cfd::js::api::json::ElementsPeginTxIn,_cfd::js::api::ElementsPeginTxInStruct>
  *this_local;
  vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
  *result;
  
  std::
  vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>).
                    super_vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
                  );
  element = (ElementsPeginTxIn *)
            std::
            vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>).
                   super_vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::ElementsPeginTxIn_*,_std::vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::ElementsPeginTxIn_*,_std::vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>_>
                 ::operator*(&__end0);
    js::api::json::ElementsPeginTxIn::ConvertToStruct
              ((ElementsPeginTxInStruct *)local_180,
               (ElementsPeginTxIn *)
               data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_180);
    js::api::ElementsPeginTxInStruct::~ElementsPeginTxInStruct((ElementsPeginTxInStruct *)local_180)
    ;
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::ElementsPeginTxIn_*,_std::vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }